

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UriCommon.c
# Opt level: O0

wchar_t uriCompareRangeW(UriTextRangeW *a,UriTextRangeW *b)

{
  int iVar1;
  wchar_t diff;
  UriTextRangeW *b_local;
  UriTextRangeW *a_local;
  
  if ((a == (UriTextRangeW *)0x0) || (b == (UriTextRangeW *)0x0)) {
    a_local._4_4_ = (uint)(a != (UriTextRangeW *)0x0) - (uint)(b != (UriTextRangeW *)0x0);
  }
  else if ((a->first == (wchar_t *)0x0) || (b->first == (wchar_t *)0x0)) {
    a_local._4_4_ = (uint)(a->first != (wchar_t *)0x0) - (uint)(b->first != (wchar_t *)0x0);
  }
  else {
    iVar1 = (int)((long)a->afterLast - (long)a->first >> 2) -
            (int)((long)b->afterLast - (long)b->first >> 2);
    if (iVar1 < 1) {
      if (iVar1 < 0) {
        a_local._4_4_ = L'\xffffffff';
      }
      else {
        a_local._4_4_ = wcsncmp(a->first,b->first,(long)a->afterLast - (long)a->first >> 2);
        if (a_local._4_4_ < L'\x01') {
          if (a_local._4_4_ < L'\0') {
            a_local._4_4_ = L'\xffffffff';
          }
        }
        else {
          a_local._4_4_ = L'\x01';
        }
      }
    }
    else {
      a_local._4_4_ = L'\x01';
    }
  }
  return a_local._4_4_;
}

Assistant:

int URI_FUNC(CompareRange)(
		const URI_TYPE(TextRange) * a,
		const URI_TYPE(TextRange) * b) {
	int diff;

	/* NOTE: Both NULL means equal! */
	if ((a == NULL) || (b == NULL)) {
		return ((a == NULL) ? 0 : 1) - ((b == NULL) ? 0 : 1);
	}

	/* NOTE: Both NULL means equal! */
	if ((a->first == NULL) || (b->first == NULL)) {
		return ((a->first == NULL) ? 0 : 1) - ((b->first == NULL) ? 0 : 1);
	}

	diff = ((int)(a->afterLast - a->first) - (int)(b->afterLast - b->first));
	if (diff > 0) {
		return 1;
	} else if (diff < 0) {
		return -1;
	}

	diff = URI_STRNCMP(a->first, b->first, (a->afterLast - a->first));

	if (diff > 0) {
		return 1;
	} else if (diff < 0) {
		return -1;
	}

	return diff;
}